

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O2

int rs_read_thing(FILE *inf,MonsterThing *t)

{
  int in_EAX;
  int iVar1;
  MonsterThing *pMVar2;
  ItemThing *pIVar3;
  int index;
  int listid;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  local_20 = -1;
  if ((read_error != '\0') || ((format_error & 1) != 0)) {
    return in_EAX;
  }
  rs_read_marker(inf,-0x5432fffe);
  iVar1 = rs_read_int(inf,&local_20);
  if (local_20 == 0) {
    return iVar1;
  }
  rs_read_coord(inf,&t->pos);
  rs_read_int(inf,&t->turn_delay);
  rs_read_char(inf,&t->type);
  rs_read_char(inf,&t->disguise);
  rs_read_int(inf,&local_1c);
  rs_read_int(inf,&local_20);
  t->reserved = -1;
  if (local_1c == 2) {
    pIVar3 = get_list_item(&lvl_obj_abi_cxx11_,local_20);
    if (pIVar3 == (ItemThing *)0x0) goto LAB_001244c4;
    pMVar2 = (MonsterThing *)&pIVar3->pos;
  }
  else {
    if (local_1c == 1) {
      t->dest = (coord *)0x0;
      t->reserved = local_20;
      goto LAB_001244c4;
    }
    if ((local_1c != 0) || (local_20 != 1)) {
      t->dest = (coord *)0x0;
      goto LAB_001244c4;
    }
    pMVar2 = &player;
  }
  t->dest = &pMVar2->pos;
LAB_001244c4:
  rs_read_int(inf,&t->flags);
  rs_read_stats(inf,&t->stats);
  iVar1 = rs_read_object_list(inf,&t->pack);
  return iVar1;
}

Assistant:

static int rs_read_thing(FILE *inf, MonsterThing *t)
{
    int listid = 0, index = -1;

    if (read_error || format_error)
        return(READSTAT);

    rs_read_marker(inf, RSID_THING);

    rs_read_int(inf, &index);

    if (index == 0)
        return(READSTAT);

    rs_read_coord(inf,&t->pos);
    rs_read_int(inf,&t->turn_delay);
    rs_read_char(inf,&t->type);
    rs_read_char(inf,&t->disguise);
            
    /* 
        t_dest can be (listid,index):
        0,0: nullptr
        0,1: location of hero
        1,i: location of a thing (monster)
        2,i: location of an object
        3,i: location of gold in a room

        We need to remember what we are chasing rather than 
        the current location of what we are chasing.
    */
            
    rs_read_int(inf, &listid);
    rs_read_int(inf, &index);
    t->reserved = -1;

    if (listid == 0) /* hero or nullptr */
    {
        if (index == 1)
            t->dest = &hero;
        else
            t->dest = nullptr;
    }
    else if (listid == 1) /* monster/thing */
    {
        t->dest     = nullptr;
        t->reserved = index;
    }
    else if (listid == 2) /* object */
    {
        ItemThing *obj;

        obj = get_list_item(lvl_obj, index);

        if (obj != nullptr)
        {
            t->dest = &obj->pos;
        }
    }
    else
        t->dest = nullptr;
            
    rs_read_int(inf,&t->flags);
    rs_read_stats(inf,&t->stats);
    rs_read_object_list(inf, t->pack);
    
    return(READSTAT);
}